

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O2

void __thiscall
soplex::ClassArray<soplex::Nonzero<double>_>::insert
          (ClassArray<soplex::Nonzero<double>_> *this,int i,int n)

{
  Nonzero<double> *pNVar1;
  long lVar2;
  long lVar3;
  
  if (0 < n) {
    lVar3 = (long)this->thesize;
    reSize(this,this->thesize + n);
    lVar2 = lVar3 << 4;
    for (; i < lVar3; lVar3 = lVar3 + -1) {
      pNVar1 = this->data;
      *(undefined4 *)((long)&pNVar1[(ulong)(uint)n - 1].idx + lVar2) =
           *(undefined4 *)(lVar2 + -8 + (long)pNVar1);
      *(undefined8 *)((long)&pNVar1[(ulong)(uint)n - 1].val + lVar2) =
           *(undefined8 *)((long)&pNVar1[-1].val + lVar2);
      lVar2 = lVar2 + -0x10;
    }
  }
  return;
}

Assistant:

void insert(int i, int n)
   {
      assert(n >= 0);
      assert(i >= 0);
      assert(i <= thesize);

      if(n > 0)
      {
         int j = thesize;

         reSize(thesize + n);
         assert(thesize == j + n);

         /// move \p n elements in memory from insert position \p i to the back
         while(j > i)
         {
            j--;
            data[j + n] = data[j];
         }
      }
   }